

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

Result * __thiscall
httplib::ClientImpl::Post
          (Result *__return_storage_ptr__,ClientImpl *this,char *path,string *body,
          char *content_type)

{
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  char *local_30;
  char *content_type_local;
  string *body_local;
  char *path_local;
  ClientImpl *this_local;
  
  local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_68._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_68._M_t._M_impl._0_8_ = 0;
  local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_30 = content_type;
  content_type_local = (char *)body;
  body_local = (string *)path;
  path_local = (char *)this;
  this_local = (ClientImpl *)__return_storage_ptr__;
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::multimap(&local_68);
  Post(__return_storage_ptr__,this,path,&local_68,(string *)content_type_local,local_30);
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~multimap(&local_68);
  return __return_storage_ptr__;
}

Assistant:

inline Result ClientImpl::Post(const char *path, const std::string &body,
                               const char *content_type) {
  return Post(path, Headers(), body, content_type);
}